

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpConnection.cpp
# Opt level: O1

ssize_t __thiscall
Liby::UdpConnection::send(UdpConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  undefined8 this_00;
  _Head_base<0UL,_std::function<void_()>_*,_false> __ptr;
  _Head_base<0UL,_std::function<void_()>_*,_false> this_01;
  UdpSocket *pUVar1;
  UdpSocket *extraout_RAX;
  UdpSocket *extraout_RAX_00;
  undefined4 in_register_00000034;
  pointer __p;
  bool bVar2;
  udp_io_task utask;
  undefined1 local_59;
  Buffer *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  undefined1 local_40 [24];
  _Head_base<0UL,_std::function<void_()>_*,_false> local_28;
  off_t local_20;
  
  if (this->socket_ != (UdpSocket *)0x0) {
    local_40._8_8_ = (element_type *)0x0;
    local_40._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_28._M_head_impl = (function<void_()> *)0x0;
    local_20 = Buffer::capacity((Buffer *)CONCAT44(in_register_00000034,__fd));
    local_58 = (Buffer *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Liby::Buffer,std::allocator<Liby::Buffer>,long>
              (a_Stack_50,&local_58,(allocator<Liby::Buffer> *)&local_59,&local_20);
    this_00 = local_40._16_8_;
    local_40._16_8_ = a_Stack_50[0]._M_pi;
    local_40._8_8_ = local_58;
    local_58 = (Buffer *)0x0;
    a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
    if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
    }
    Buffer::swap((Buffer *)local_40._8_8_,(Buffer *)CONCAT44(in_register_00000034,__fd));
    local_40._0_8_ = &this->peer_;
    if (*(long *)((long)__buf + 0x10) != 0) {
      this_01._M_head_impl = (function<void_()> *)operator_new(0x20);
      std::function<void_()>::function(this_01._M_head_impl,(function<void_()> *)__buf);
      __ptr._M_head_impl = local_28._M_head_impl;
      local_58 = (Buffer *)0x0;
      bVar2 = (tuple<std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>)
              local_28._M_head_impl != (_Head_base<0UL,_std::function<void_()>_*,_false>)0x0;
      local_28._M_head_impl = this_01._M_head_impl;
      if (bVar2) {
        std::default_delete<std::function<void_()>_>::operator()
                  ((default_delete<std::function<void_()>_> *)&local_28,__ptr._M_head_impl);
      }
      if (local_58 != (Buffer *)0x0) {
        std::default_delete<std::function<void_()>_>::operator()
                  ((default_delete<std::function<void_()>_> *)&local_58,
                   (function<void_()> *)local_58);
      }
    }
    pUVar1 = this->socket_;
    std::deque<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>::
    emplace_back<Liby::udp_io_task>(&pUVar1->writTasks_,(udp_io_task *)local_40);
    pUVar1 = UdpSocket::enableWrit(pUVar1,true);
    if (local_28._M_head_impl != (function<void_()> *)0x0) {
      std::default_delete<std::function<void_()>_>::operator()
                ((default_delete<std::function<void_()>_> *)&local_28,local_28._M_head_impl);
      pUVar1 = extraout_RAX;
    }
    local_28._M_head_impl = (function<void_()> *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._16_8_);
      pUVar1 = extraout_RAX_00;
    }
    return (ssize_t)pUVar1;
  }
  __assert_fail("socket_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpConnection.cpp"
                ,0x13,"void Liby::UdpConnection::send(Liby::Buffer &, const BasicHandler &)");
}

Assistant:

void UdpConnection::send(Liby::Buffer &buf, const BasicHandler &handler) {
    assert(socket_);
    udp_io_task utask;
    utask.buffer_ = std::make_shared<Buffer>(buf.capacity());
    utask.buffer_->swap(buf);
    utask.dest_ = &peer_;
    if (handler) {
        utask.handler_ = std::make_unique<BasicHandler>(handler);
    }
    socket_->send(std::move(utask));
}